

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O3

int Msat_SolverSimplifyDB(Msat_Solver_t *p)

{
  Msat_ClauseVec_t *p_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Msat_Clause_t *pMVar6;
  int *pAssigns;
  Msat_Clause_t **ppMVar7;
  long lVar8;
  ulong uVar9;
  int nSizeNew;
  
  iVar3 = Msat_SolverReadDecisionLevel(p);
  if (iVar3 != 0) {
    __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                  ,0x122,"int Msat_SolverSimplifyDB(Msat_Solver_t *)");
  }
  pMVar6 = Msat_SolverPropagate(p);
  iVar3 = 0;
  if (pMVar6 == (Msat_Clause_t *)0x0) {
    pAssigns = Msat_SolverReadAssignsArray(p);
    iVar3 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      p_00 = (&p->vClauses)[(byte)~bVar1];
      uVar4 = Msat_ClauseVecReadSize(p_00);
      ppMVar7 = Msat_ClauseVecReadArray(p_00);
      if ((int)uVar4 < 1) {
        nSizeNew = 0;
      }
      else {
        uVar9 = 0;
        nSizeNew = 0;
        do {
          iVar5 = Msat_ClauseSimplify(ppMVar7[uVar9],pAssigns);
          pMVar6 = ppMVar7[uVar9];
          if (iVar5 == 0) {
            lVar8 = (long)nSizeNew;
            nSizeNew = nSizeNew + 1;
            ppMVar7[lVar8] = pMVar6;
            Msat_ClauseSetNum(pMVar6,iVar3);
            iVar3 = iVar3 + 1;
          }
          else {
            Msat_ClauseFree(p,pMVar6,1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar4 != uVar9);
      }
      Msat_ClauseVecShrink(p_00,nSizeNew);
      bVar2 = false;
    } while (bVar1);
    p->nClauses = iVar3;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int  Msat_SolverSimplifyDB( Msat_Solver_t * p )
{
    Msat_ClauseVec_t * vClauses;
    Msat_Clause_t ** pClauses;
    int nClauses, Type, i, j;
    int * pAssigns;
    int Counter;

    assert( Msat_SolverReadDecisionLevel(p) == 0 );
    if ( Msat_SolverPropagate(p) != NULL )
        return 0;
//Msat_SolverPrintClauses( p );
//Msat_SolverPrintAssignment( p );
//printf( "Simplification\n" );

    // simplify and reassign clause numbers
    Counter = 0;
    pAssigns = Msat_SolverReadAssignsArray( p );
    for ( Type = 0; Type < 2; Type++ )
    {
        vClauses = Type? p->vLearned : p->vClauses;
        nClauses = Msat_ClauseVecReadSize( vClauses );
        pClauses = Msat_ClauseVecReadArray( vClauses );
        for ( i = j = 0; i < nClauses; i++ )
            if ( Msat_ClauseSimplify( pClauses[i], pAssigns ) )
                Msat_ClauseFree( p, pClauses[i], 1 );
            else
            {
                pClauses[j++] = pClauses[i];
                Msat_ClauseSetNum( pClauses[i], Counter++ );
            }
        Msat_ClauseVecShrink( vClauses, j );
    }
    p->nClauses = Counter;
    return 1;
}